

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFFLoader.h
# Opt level: O0

void __thiscall Assimp::NFFImporter::MeshInfo::MeshInfo(MeshInfo *this,PatchType _pType,bool bL)

{
  bool bL_local;
  PatchType _pType_local;
  MeshInfo *this_local;
  
  ShadingInfo::ShadingInfo(&this->shader);
  this->pType = _pType;
  this->bLocked = bL;
  aiVector3t<float>::aiVector3t(&this->center);
  aiVector3t<float>::aiVector3t(&this->radius,1.0,1.0,1.0);
  aiVector3t<float>::aiVector3t(&this->dir,0.0,1.0,0.0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector(&this->vertices);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector(&this->normals);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector(&this->uvs);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->faces);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::vector(&this->colors);
  this->matIndex = 0;
  this->name[0] = '\0';
  return;
}

Assistant:

MeshInfo(PatchType _pType, bool bL = false)
            : pType     (_pType)
            , bLocked   (bL)
            , radius    (1.f,1.f,1.f)
            , dir       (0.f,1.f,0.f)
            , matIndex  (0)
        {
            name[0] = '\0'; // by default meshes are unnamed
        }